

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               *this,raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                     *that,allocator_type *a)

{
  undefined1 uVar1;
  reference hashval_00;
  hasher *phVar2;
  size_t sVar3;
  size_t *psVar4;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *in_RSI;
  long in_RDI;
  FindInfo FVar5;
  FindInfo target;
  size_t hashval;
  value_type *v;
  const_iterator __end0;
  const_iterator __begin0;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *__range3;
  pair<const_cs_impl::any,_cs_impl::any> *in_stack_fffffffffffffef8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff30;
  key_equal *in_stack_ffffffffffffff38;
  undefined8 *puVar6;
  hasher *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined8 local_68;
  size_t local_60;
  reference local_58;
  iterator local_50;
  iterator local_40;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *local_30;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *local_10;
  
  local_10 = in_RSI;
  hash_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
            *)0x47232c);
  eq_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
          *)0x472341);
  raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff30);
  capacity(local_10);
  rehash(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_30 = local_10;
  local_40 = (iterator)begin(in_stack_ffffffffffffff00);
  local_50 = (iterator)end(in_stack_ffffffffffffff00);
  while( true ) {
    uVar1 = priv::operator!=((const_iterator *)in_stack_ffffffffffffff00,
                             (const_iterator *)in_stack_fffffffffffffef8);
    if (!(bool)uVar1) break;
    hashval_00 = const_iterator::operator*((const_iterator *)0x47242f);
    puVar6 = &local_68;
    local_58 = hashval_00;
    phVar2 = hash_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                       *)0x47245d);
    *puVar6 = phVar2;
    local_60 = hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,void>::
               apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>::HashElement,std::pair<cs_impl::any_const,cs_impl::any>const&,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
                         ((HashElement *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    FVar5 = find_first_non_full((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                                 *)CONCAT17(uVar1,in_stack_ffffffffffffff50),(size_t)hashval_00);
    H2(local_60);
    set_ctrl(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (ctrl_t)((ulong)in_stack_ffffffffffffff00 >> 0x38));
    raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
    ::emplace_at<std::pair<cs_impl::any_const,cs_impl::any>const&>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (pair<const_cs_impl::any,_cs_impl::any> *)in_stack_ffffffffffffff00);
    HashtablezInfoHandle::RecordInsert
              ((HashtablezInfoHandle *)(in_RDI + 0x20),local_60,FVar5.probe_length);
    const_iterator::operator++((const_iterator *)in_stack_ffffffffffffff00);
  }
  sVar3 = size(local_10);
  *(size_t *)(in_RDI + 0x10) = sVar3;
  sVar3 = size(local_10);
  psVar4 = growth_left((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                        *)0x4725c3);
  *psVar4 = *psVar4 - sVar3;
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that, const allocator_type& a)
				: raw_hash_set(0, that.hash_ref(), that.eq_ref(), a)
			{
				rehash(that.capacity());   // operator=() should preserve load_factor
				// Because the table is guaranteed to be empty, we can do something faster
				// than a full `insert`.
				for (const auto& v : that) {
					const size_t hashval = PolicyTraits::apply(HashElement{hash_ref()}, v);
					auto target = find_first_non_full(hashval);
					set_ctrl(target.offset, H2(hashval));
					emplace_at(target.offset, v);
					infoz_.RecordInsert(hashval, target.probe_length);
				}
				size_ = that.size();
				growth_left() -= that.size();
			}